

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aircraft.cpp
# Opt level: O0

void __thiscall XPMP2::Aircraft::SetRender(Aircraft *this,bool _bRender)

{
  byte in_SIL;
  long in_RDI;
  undefined7 in_stack_fffffffffffffff0;
  
  if (((*(byte *)(in_RDI + 0x1f2) & 1) != (in_SIL & 1)) &&
     (*(byte *)(in_RDI + 0x1f2) = in_SIL & 1, (*(byte *)(in_RDI + 0x1f2) & 1) == 0)) {
    DestroyInstances((Aircraft *)(CONCAT17(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffffffffffff));
  }
  return;
}

Assistant:

void Aircraft::SetRender (bool _bRender)
{
    // no change?
    if (bRender == _bRender)
        return;
    
    // Set the flag
    bRender = _bRender;
    
    // In case rendering is _now_ switched off: Remove the instance (but leave AI as is!)
    if (!bRender)
        DestroyInstances();
}